

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O3

int mem_iraf_open(char *filename,int rwmode,int *hdl)

{
  int iVar1;
  size_t *psVar2;
  long lVar3;
  size_t filesize;
  int local_24;
  size_t local_20;
  
  local_20 = 0;
  *hdl = -1;
  psVar2 = &memTable[0].memsize;
  lVar3 = 0;
  do {
    if (((memdriver *)(psVar2 + -3))->memaddrptr == (char **)0x0) {
      *hdl = (int)lVar3;
      ((memdriver *)(psVar2 + -3))->memaddrptr = (char **)(psVar2 + -2);
      psVar2[-1] = (size_t)psVar2;
      *psVar2 = 0;
      psVar2[1] = 0xb40;
      psVar2[3] = 0;
      psVar2[4] = 0;
      psVar2[2] = (size_t)realloc;
      local_24 = 0;
      local_24 = iraf2mem(filename,memTable[*hdl].memaddrptr,memTable[*hdl].memsizeptr,&local_20,
                          &local_24);
      iVar1 = *hdl;
      if (local_24 != 0) {
        free(*memTable[iVar1].memaddrptr);
        memTable[iVar1].memaddrptr = (char **)0x0;
        memTable[iVar1].memaddr = (char *)0x0;
        ffpmsg("failed to convert IRAF file into memory (mem_iraf_open)");
        return local_24;
      }
      memTable[iVar1].currentpos = 0;
      memTable[iVar1].fitsfilesize = local_20;
      return 0;
    }
    lVar3 = lVar3 + 1;
    psVar2 = psVar2 + 9;
  } while (lVar3 != 10000);
  ffpmsg("failed to create empty memory file (mem_iraf_open)");
  return 0x67;
}

Assistant:

int mem_iraf_open(char *filename, int rwmode, int *hdl)
/*
  This routine creates an empty memory buffer, then calls iraf2mem to
  open the IRAF disk file and convert it to a FITS file in memeory.
*/
{
    int status;
    size_t filesize = 0;

    /* create a memory file with size = 0 for the FITS converted IRAF file */
    status = mem_createmem(filesize, hdl);
    if (status)
    {
        ffpmsg("failed to create empty memory file (mem_iraf_open)");
        return(status);
    }

    /* convert the iraf file into a FITS file in memory */
    status = iraf2mem(filename, memTable[*hdl].memaddrptr,
                      memTable[*hdl].memsizeptr, &filesize, &status);

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to convert IRAF file into memory (mem_iraf_open)");
        return(status);
    }

    memTable[*hdl].currentpos = 0;           /* save starting position */
    memTable[*hdl].fitsfilesize=filesize;   /* and initial file size  */

    return(0);
}